

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void LearnVocabFromTrainFile(void)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  char word [100];
  char acStack_98 [104];
  
  memset(vocab_hash,0xff,120000000);
  __stream = fopen(train_file,"rb");
  if (__stream != (FILE *)0x0) {
    vocab_size = 0;
    AddWordToVocab("</s>");
    ReadWord(acStack_98,(FILE *)__stream);
    iVar2 = feof(__stream);
    lVar1 = train_words;
    while (iVar2 == 0) {
      train_words = lVar1 + 1;
      if ((1 < debug_mode) && ((train_words / 100000) * -100000 + lVar1 == -1)) {
        printf("%lldK%c",train_words / 1000,0xd);
        fflush(_stdout);
      }
      iVar2 = SearchVocab(acStack_98);
      if (iVar2 == -1) {
        iVar2 = AddWordToVocab(acStack_98);
        vocab[iVar2].cn = 1;
      }
      else {
        vocab[iVar2].cn = vocab[iVar2].cn + 1;
      }
      if (21000000 < vocab_size) {
        ReduceVocab();
      }
      ReadWord(acStack_98,(FILE *)__stream);
      iVar2 = feof(__stream);
      lVar1 = train_words;
    }
    train_words = lVar1;
    SortVocab();
    if (0 < debug_mode) {
      printf("Vocab size: %lld\n",vocab_size);
      printf("Words in train file: %lld\n",train_words);
    }
    file_size = ftell(__stream);
    fclose(__stream);
    return;
  }
  puts("ERROR: training data file not found!");
  exit(1);
}

Assistant:

void LearnVocabFromTrainFile() {
  char word[MAX_STRING];
  FILE *fin;
  long long a, i;
  for (a = 0; a < vocab_hash_size; a++) vocab_hash[a] = -1;
  fin = fopen(train_file, "rb");
  if (fin == NULL) {
    printf("ERROR: training data file not found!\n");
    exit(1);
  }
  vocab_size = 0;
  AddWordToVocab((char *)"</s>");
  while (1) {
    ReadWord(word, fin);
    if (feof(fin)) break;
    train_words++;
    if ((debug_mode > 1) && (train_words % 100000 == 0)) {
      printf("%lldK%c", train_words / 1000, 13);
      fflush(stdout);
    }
    i = SearchVocab(word);
    if (i == -1) {
      a = AddWordToVocab(word);
      vocab[a].cn = 1;
    } else vocab[i].cn++;
    if (vocab_size > vocab_hash_size * 0.7) ReduceVocab();
  }
  SortVocab();
  if (debug_mode > 0) {
    printf("Vocab size: %lld\n", vocab_size);
    printf("Words in train file: %lld\n", train_words);
  }
  file_size = ftell(fin);
  fclose(fin);
}